

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_buffer.hpp
# Opt level: O3

void __thiscall
duckdb::DictionaryBuffer::DictionaryBuffer(DictionaryBuffer *this,buffer_ptr<SelectionData> *data)

{
  buffer_ptr<SelectionData> local_28;
  
  VectorBuffer::VectorBuffer(&this->super_VectorBuffer,DICTIONARY_BUFFER);
  (this->super_VectorBuffer)._vptr_VectorBuffer = (_func_int **)&PTR__DictionaryBuffer_0244ec68;
  local_28.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (data->internal).super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_28.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (data->internal).super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  (data->internal).super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (data->internal).super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  SelectionVector::SelectionVector(&this->sel_vector,&local_28);
  if (local_28.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  (this->dictionary_size).index = 0xffffffffffffffff;
  (this->dictionary_id)._M_dataplus._M_p = (pointer)&(this->dictionary_id).field_2;
  (this->dictionary_id)._M_string_length = 0;
  (this->dictionary_id).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit DictionaryBuffer(buffer_ptr<SelectionData> data)
	    : VectorBuffer(VectorBufferType::DICTIONARY_BUFFER), sel_vector(std::move(data)) {
	}